

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * executeStatement(Object *__return_storage_ptr__,Statement s,Environment *env)

{
  Container c;
  Routine r;
  undefined4 uVar1;
  undefined8 uVar2;
  CallStatement cs;
  ReturnStatement rs;
  Statement *in_stack_ffffffffffffffc8;
  Environment *env_local;
  
  uVar1 = s.field_1.blockStatement.numStatements;
  uVar2 = s.field_1.blockStatement.statements;
  switch(s.type) {
  case STATEMENT_SET:
    executeSet(__return_storage_ptr__,s.field_1.setStatement,env);
    break;
  case STATEMENT_ARRAY:
    executeArray(__return_storage_ptr__,s.field_1.arrayStatement,env);
    break;
  case STATEMENT_INPUT:
    executeInput(__return_storage_ptr__,s.field_1.inputStatement,env);
    break;
  case STATEMENT_IF:
    executeIf(__return_storage_ptr__,s.field_1.ifStatement,env);
    break;
  case STATEMENT_WHILE:
    executeWhile(__return_storage_ptr__,s.field_1.whileStatement,env);
    break;
  case STATEMENT_BREAK:
    executeBreak();
    break;
  case STATEMENT_PRINT:
    executePrint(__return_storage_ptr__,s.field_1.printStatement,env);
    break;
  case STATEMENT_BEGIN:
    executeBegin();
    break;
  case STATEMENT_ROUTINE:
    r.code.statements = (Statement *)__return_storage_ptr__;
    r.line = s.field_1._8_4_;
    r._4_4_ = s.field_1._12_4_;
    r.name = (char *)s.field_1._16_8_;
    r.arity = s.field_1._24_4_;
    r._20_4_ = s.field_1._28_4_;
    r.arguments = (char **)s.field_1._32_8_;
    r.isNative = s.field_1._40_2_;
    r._34_6_ = s.field_1._42_6_;
    r.code.numStatements = s.field_1._48_4_;
    r.code.blockName = s.field_1._52_4_;
    registerRoutine(r);
    break;
  case STATEMENT_CALL:
    cs._4_4_ = 0;
    cs.line = uVar1;
    cs.callee = (Expression *)uVar2;
    executeCall(__return_storage_ptr__,cs,env);
    break;
  case STATEMENT_RETURN:
    rs._4_4_ = 0;
    rs.line = uVar1;
    rs.value = (Expression *)uVar2;
    executeReturn(__return_storage_ptr__,rs,env);
    break;
  case STATEMENT_CONTAINER:
    c.constructor.statements = in_stack_ffffffffffffffc8;
    c.line = s.field_1._8_4_;
    c._4_4_ = s.field_1._12_4_;
    c.name = (char *)s.field_1._16_8_;
    c.arity = s.field_1._24_4_;
    c._20_4_ = s.field_1._28_4_;
    c.arguments = (char **)s.field_1._32_8_;
    c.constructor.numStatements = s.field_1._40_4_;
    c.constructor.blockName = s.field_1._44_4_;
    registerContainer(c);
    break;
  case STATEMENT_NOOP:
  default:
    memcpy(__return_storage_ptr__,&nullObject,0x40);
    break;
  case STATEMENT_END:
    executeEnd();
  }
  return __return_storage_ptr__;
}

Assistant:

static Object executeStatement(Statement s, Environment *env){
    switch(s.type){
        case STATEMENT_PRINT:
            return executePrint(s.printStatement, env);
        case STATEMENT_IF:
            return executeIf(s.ifStatement, env);
        case STATEMENT_WHILE:
            return executeWhile(s.whileStatement, env);
        case STATEMENT_SET:
            return executeSet(s.setStatement, env);
        case STATEMENT_ARRAY:
            return executeArray(s.arrayStatement, env);
        case STATEMENT_INPUT:
            return executeInput(s.inputStatement, env);
        case STATEMENT_BREAK:
            return executeBreak();
        case STATEMENT_END:
            return executeEnd();
        case STATEMENT_BEGIN:
            return executeBegin();
            //       case STATEMENT_DO:
            //           executeDo(s.)
        case STATEMENT_ROUTINE:
            return registerRoutine(s.routine);
        case STATEMENT_CONTAINER:
            return registerContainer(s.container);
        case STATEMENT_CALL:
            return executeCall(s.callStatement, env);
        case STATEMENT_NOOP:
            break;
        case STATEMENT_RETURN:
            return executeReturn(s.returnStatement, env);
        default:
            break;
    }
    return nullObject;
}